

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypePrimitiveReader.cpp
# Opt level: O1

EStatusCode __thiscall
OpenTypePrimitiveReader::ReadLongDateTime(OpenTypePrimitiveReader *this,longlong *outValue)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar2;
  EStatusCode EVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  Byte buffer;
  Byte buffer_1;
  Byte buffer_2;
  Byte buffer_3;
  Byte buffer_4;
  Byte buffer_5;
  Byte buffer_6;
  Byte buffer_7;
  byte local_58;
  byte local_57;
  byte local_56;
  byte local_55;
  byte local_54;
  byte local_53;
  byte local_52;
  byte local_51;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (this->mInternalState == eFailure) {
    lVar6 = 0;
    bVar7 = false;
  }
  else {
    iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                      (this->mOpenTypeFile,&local_58,1);
    bVar7 = CONCAT44(extraout_var,iVar1) == 1;
    if (!bVar7) {
      this->mInternalState = eFailure;
    }
    lVar6 = (ulong)local_58 << 0x38;
  }
  EVar3 = eFailure;
  if (bVar7) {
    if (this->mInternalState == eFailure) {
      lVar4 = 0;
      bVar7 = false;
    }
    else {
      iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                        (this->mOpenTypeFile,&local_57,1);
      bVar7 = CONCAT44(extraout_var_00,iVar1) == 1;
      if (!bVar7) {
        this->mInternalState = eFailure;
      }
      lVar4 = (ulong)local_57 << 0x30;
    }
    if (bVar7) {
      if (this->mInternalState == eFailure) {
        lVar5 = 0;
        bVar7 = false;
      }
      else {
        iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                          (this->mOpenTypeFile,&local_56,1);
        bVar7 = CONCAT44(extraout_var_01,iVar1) == 1;
        if (!bVar7) {
          this->mInternalState = eFailure;
        }
        lVar5 = (ulong)local_56 << 0x28;
      }
      if (bVar7) {
        if (this->mInternalState == eFailure) {
          local_40 = 0;
          bVar7 = false;
        }
        else {
          iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                            (this->mOpenTypeFile,&local_55,1);
          bVar7 = CONCAT44(extraout_var_02,iVar1) == 1;
          if (!bVar7) {
            this->mInternalState = eFailure;
          }
          local_40 = (ulong)local_55 << 0x20;
        }
        if (bVar7) {
          if (this->mInternalState == eFailure) {
            local_48 = 0;
            bVar7 = false;
          }
          else {
            iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                              (this->mOpenTypeFile,&local_54,1);
            bVar7 = CONCAT44(extraout_var_03,iVar1) == 1;
            if (!bVar7) {
              this->mInternalState = eFailure;
            }
            local_48 = (ulong)local_54 << 0x18;
          }
          if (bVar7) {
            if (this->mInternalState == eFailure) {
              local_50 = 0;
              bVar7 = false;
            }
            else {
              iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                                (this->mOpenTypeFile,&local_53,1);
              bVar7 = CONCAT44(extraout_var_04,iVar1) == 1;
              if (!bVar7) {
                this->mInternalState = eFailure;
              }
              local_50 = (ulong)local_53 << 0x10;
            }
            if (bVar7) {
              if (this->mInternalState == eFailure) {
                local_38 = 0;
                bVar7 = false;
              }
              else {
                iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                                  (this->mOpenTypeFile,&local_52,1);
                bVar7 = CONCAT44(extraout_var_05,iVar1) == 1;
                if (!bVar7) {
                  this->mInternalState = eFailure;
                }
                local_38 = (ulong)local_52 << 8;
              }
              if (bVar7) {
                if (this->mInternalState == eFailure) {
                  uVar2 = 0;
                  bVar7 = false;
                }
                else {
                  iVar1 = (*(this->mOpenTypeFile->super_IByteReader)._vptr_IByteReader[2])
                                    (this->mOpenTypeFile,&local_51,1);
                  bVar7 = CONCAT44(extraout_var_06,iVar1) == 1;
                  if (!bVar7) {
                    this->mInternalState = eFailure;
                  }
                  uVar2 = (ulong)local_51;
                }
                if (bVar7) {
                  *outValue = local_48 + local_50 + local_38 + lVar5 + local_40 + lVar4 + lVar6 +
                              uVar2;
                  EVar3 = eSuccess;
                }
              }
            }
          }
        }
      }
    }
  }
  return EVar3;
}

Assistant:

EStatusCode OpenTypePrimitiveReader::ReadLongDateTime(long long& outValue)
{
	Byte byte1,byte2,byte3,byte4,byte5,byte6,byte7,byte8;

	if(ReadBYTE(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte3) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte4) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte5) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte6) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte7) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadBYTE(byte8) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	outValue =(long long)(	((unsigned long long)byte1 << 56) + ((unsigned long long)byte2 << 48) + 
							((unsigned long long)byte3 << 40) + ((unsigned long long)byte4 << 32) + 
							((unsigned long long)byte5 << 24) + ((unsigned long long)byte6 << 16) + 
							((unsigned long long)byte7 << 8) + byte8);
	return PDFHummus::eSuccess;	
}